

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ExpressionLhs<const_unsigned_long_&>::endExpression
          (ExpressionLhs<const_unsigned_long_&> *this)

{
  unsigned_long uVar1;
  ResultBuilder *pRVar2;
  bool in_DL;
  string sStack_38;
  
  pRVar2 = this->m_rb;
  uVar1 = *this->m_lhs;
  Catch::toString_abi_cxx11_(&sStack_38,(Catch *)(ulong)(uVar1 != 0),in_DL);
  pRVar2 = ResultBuilder::setLhs(pRVar2,&sStack_38);
  pRVar2 = ResultBuilder::setResultType(pRVar2,uVar1 != 0);
  ResultBuilder::endExpression(pRVar2);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }